

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O0

maybe<char32_t,_void> * __thiscall
pstore::utf::utf8_decoder::get
          (maybe<char32_t,_void> *__return_storage_ptr__,utf8_decoder *this,uint8_t byte)

{
  uint8_t uVar1;
  char32_t *value;
  char32_t local_34;
  not_null<char32_t_*> nStack_30;
  char32_t res;
  not_null<unsigned_char_*> local_28;
  byte local_19;
  utf8_decoder *puStack_18;
  uint8_t byte_local;
  utf8_decoder *this_local;
  
  local_19 = byte;
  puStack_18 = this;
  this_local = (utf8_decoder *)__return_storage_ptr__;
  gsl::not_null<unsigned_char_*>::not_null(&local_28,&this->state_);
  gsl::not_null<char32_t_*>::not_null(&stack0xffffffffffffffd0,&this->codepoint_);
  uVar1 = decode(local_28,nStack_30,(uint)local_19);
  if (uVar1 == '\0') {
    local_34 = this->codepoint_;
    this->well_formed_ = true;
    this->codepoint_ = L'\0';
    just<char32_t_const&>(__return_storage_ptr__,(pstore *)&local_34,value);
  }
  else {
    this->well_formed_ = false;
    nothing<char32_t>();
  }
  return __return_storage_ptr__;
}

Assistant:

auto utf8_decoder::get (std::uint8_t const byte) noexcept -> maybe<char32_t> {
            if (decode (&state_, &codepoint_, byte) != 0U) {
                well_formed_ = false;
                return nothing<char32_t> ();
            }
            auto const res = codepoint_;
            well_formed_ = true;
            codepoint_ = 0;
            return just (res);
        }